

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.hpp
# Opt level: O0

any * __thiscall Json::operator[](Json *this,int index)

{
  bool bVar1;
  vector<std::any,_std::allocator<std::any>_> *this_00;
  reference pvVar2;
  bad_any_cast *this_01;
  vector<std::any,_std::allocator<std::any>_> *data;
  int index_local;
  Json *this_local;
  
  bVar1 = is_array(this);
  if (!bVar1) {
    this_01 = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this_01,0,8);
    std::bad_any_cast::bad_any_cast(this_01);
    __cxa_throw(this_01,&std::bad_any_cast::typeinfo,std::bad_any_cast::~bad_any_cast);
  }
  this_00 = std::any_cast<std::vector<std::any,std::allocator<std::any>>&>(&this->_data);
  pvVar2 = std::vector<std::any,_std::allocator<std::any>_>::operator[](this_00,(long)index);
  return pvVar2;
}

Assistant:

std::any &operator[](int index) {
        if (this->is_array()) {
            auto &data =
                    std::any_cast<std::vector<std::any> &>(_data);
            return data[index];
        } else {
            throw std::bad_any_cast();
        }
    }